

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O2

Bytes __thiscall
Omega_h::prevent_coarsen_flip2_dim<3>
          (Omega_h *this,Mesh *mesh,Bytes *sides_matter,Bytes *verts_matter,Reals *vert_normals,
          LOs *cands2edges,Bytes cand_codes,Real epsilon)

{
  Alloc *pAVar1;
  Int IVar2;
  void *extraout_RDX;
  LO size_in;
  ulong uVar3;
  Bytes BVar4;
  allocator local_1a9;
  Write<signed_char> out;
  Write<int> local_188;
  Write<signed_char> local_178;
  Write<signed_char> local_168;
  Reals coords;
  LOs sv2v;
  LOs ev2v;
  type f;
  Adj v2s;
  
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 3) {
    IVar2 = (Int)mesh;
    Mesh::ask_verts_of((Mesh *)&ev2v,IVar2);
    Mesh::ask_verts_of((Mesh *)&sv2v,IVar2);
    Mesh::ask_up(&v2s,mesh,0,2);
    Mesh::coords((Mesh *)&coords);
    pAVar1 = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      uVar3 = pAVar1->size;
    }
    else {
      uVar3 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&f,"",&local_1a9);
    size_in = (LO)(uVar3 >> 2);
    Write<signed_char>::Write(&out,size_in,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<int>::Write((Write<int> *)&f,&cands2edges->write_);
    Write<signed_char>::Write
              (&f.cand_codes.write_,(Write<signed_char> *)cand_codes.write_.shared_alloc_.alloc);
    Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
    Write<signed_char>::Write(&f.verts_matter.write_,&verts_matter->write_);
    Adj::Adj(&f.v2s,&v2s);
    Write<signed_char>::Write(&f.sides_matter.write_,&sides_matter->write_);
    Write<int>::Write(&f.sv2v.write_,&sv2v.write_);
    Write<double>::Write(&f.coords.write_,&coords.write_);
    Write<double>::Write(&f.vert_normals.write_,&vert_normals->write_);
    f.epsilon = epsilon;
    Write<signed_char>::Write(&f.out,&out);
    parallel_for<Omega_h::prevent_coarsen_flip2_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
              (size_in,&f,"prevent_coarsen_flip");
    Write<signed_char>::Write(&local_178,&out);
    Read<signed_char>::Read((Read<signed_char> *)&local_168,&local_178);
    Write<int>::Write(&local_188,&cands2edges->write_);
    Mesh::sync_subset_array<signed_char>
              ((Mesh *)this,IVar2,(Read<signed_char> *)0x1,(LOs *)&local_168,(char)&local_188,0);
    Write<int>::~Write(&local_188);
    Write<signed_char>::~Write(&local_168);
    Write<signed_char>::~Write(&local_178);
    prevent_coarsen_flip2_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<signed_char>,double)
    ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
    Write<signed_char>::~Write(&out);
    Write<double>::~Write(&coords.write_);
    Adj::~Adj(&v2s);
    Write<int>::~Write(&sv2v.write_);
    Write<int>::~Write(&ev2v.write_);
    BVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->dim() == dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_flip.cpp"
       ,0x4a);
}

Assistant:

Bytes prevent_coarsen_flip2_dim(Mesh* mesh,
    Bytes sides_matter,  // exposed sides adjacent to candidate vertices
    Bytes verts_matter,  // vertices adjacent to sides that matter
    Reals vert_normals, LOs cands2edges, Bytes cand_codes,
    Real epsilon = OMEGA_H_EPSILON) {  // below this value a dot product is
                                       // considered negative
  OMEGA_H_CHECK(mesh->dim() == dim);
  constexpr auto side_dim = dim - 1;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto coords = mesh->coords();
  auto ncands = cands2edges.size();
  auto out = Write<Byte>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      if (!verts_matter[v_col]) continue;
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      for (auto vs = v2s.a2ab[v_col]; vs < v2s.a2ab[v_col + 1]; ++vs) {
        auto s = v2s.ab2b[vs];
        if (!sides_matter[s]) continue;
        auto vs_code = v2s.codes[vs];
        auto ssv_col = code_which_down(vs_code);
        auto ssv2v = gather_verts<side_dim + 1>(sv2v, s);
        Int ssv;
        for (ssv = 0; ssv < side_dim + 1; ++ssv) {
          if (ssv2v[ssv] == v_onto) break;  // ignore sides that will disappear
        }
        if (ssv != side_dim + 1)
          continue;               // ignore sides that will disappear (part 2)
        ssv2v[ssv_col] = v_onto;  // simulate the edge collapse on this side
        auto ssv2x = gather_vectors<side_dim + 1, dim>(coords, ssv2v);
        auto sn = get_side_vector(ssv2x);  // get its new normal
        // compare the new side normal with the old normals of its vertices
        auto ssv2n = gather_vectors<side_dim + 1, dim>(vert_normals, ssv2v);
        for (ssv = 0; ssv < side_dim + 1; ++ssv) {
          if (ssv2n[ssv] * sn < epsilon) break;
        }
        if (ssv < side_dim + 1) {  // got a violator here
          code = dont_collapse(code, eev_col);
        }
      }
    }
    out[cand] = code;
  };
  parallel_for(ncands, f, "prevent_coarsen_flip");
  return mesh->sync_subset_array(
      EDGE, Bytes(out), cands2edges, I8(DONT_COLLAPSE), 1);
}